

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

slist * gen_loadx_iphdrlen(compiler_state_t *cstate)

{
  slist *p;
  slist *psVar1;
  slist *psVar2;
  slist *psVar3;
  slist *psVar4;
  
  psVar1 = gen_abs_offset_varpart(cstate,&cstate->off_linkpl);
  psVar2 = (slist *)newchunk(cstate,0x28);
  if (psVar1 == (slist *)0x0) {
    (psVar2->s).code = 0xb1;
    (psVar2->s).k = cstate->off_nl + (cstate->off_linkpl).constant_part;
  }
  else {
    (psVar2->s).code = 0x50;
    (psVar2->s).k = cstate->off_nl + (cstate->off_linkpl).constant_part;
    psVar3 = psVar1;
    do {
      psVar4 = psVar3;
      psVar3 = psVar4->next;
    } while (psVar3 != (slist *)0x0);
    psVar4->next = psVar2;
    psVar3 = (slist *)newchunk(cstate,0x28);
    (psVar3->s).code = 0x54;
    (psVar3->s).k = 0xf;
    psVar2 = psVar1;
    do {
      psVar4 = psVar2;
      psVar2 = psVar4->next;
    } while (psVar2 != (slist *)0x0);
    psVar4->next = psVar3;
    psVar3 = (slist *)newchunk(cstate,0x28);
    (psVar3->s).code = 100;
    (psVar3->s).k = 2;
    psVar2 = psVar1;
    do {
      psVar4 = psVar2;
      psVar2 = psVar4->next;
    } while (psVar2 != (slist *)0x0);
    psVar4->next = psVar3;
    psVar3 = (slist *)newchunk(cstate,0x28);
    (psVar3->s).code = 0xc;
    psVar2 = psVar1;
    do {
      psVar4 = psVar2;
      psVar2 = psVar4->next;
    } while (psVar2 != (slist *)0x0);
    psVar4->next = psVar3;
    psVar3 = (slist *)newchunk(cstate,0x28);
    (psVar3->s).code = 7;
    psVar2 = psVar1;
    do {
      psVar4 = psVar2;
      psVar2 = psVar4->next;
    } while (psVar2 != (slist *)0x0);
    psVar4->next = psVar3;
    psVar2 = psVar1;
  }
  return psVar2;
}

Assistant:

static struct slist *
gen_loadx_iphdrlen(compiler_state_t *cstate)
{
	struct slist *s, *s2;

	s = gen_abs_offset_varpart(cstate, &cstate->off_linkpl);
	if (s != NULL) {
		/*
		 * The offset of the link-layer payload has a variable
		 * part.  "s" points to a list of statements that put
		 * the variable part of that offset into the X register.
		 *
		 * The 4*([k]&0xf) addressing mode can't be used, as we
		 * don't have a constant offset, so we have to load the
		 * value in question into the A register and add to it
		 * the value from the X register.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
		s2->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		sappend(s, s2);
		s2 = new_stmt(cstate, BPF_ALU|BPF_AND|BPF_K);
		s2->s.k = 0xf;
		sappend(s, s2);
		s2 = new_stmt(cstate, BPF_ALU|BPF_LSH|BPF_K);
		s2->s.k = 2;
		sappend(s, s2);

		/*
		 * The A register now contains the length of the IP header.
		 * We need to add to it the variable part of the offset of
		 * the link-layer payload, which is still in the X
		 * register, and move the result into the X register.
		 */
		sappend(s, new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X));
		sappend(s, new_stmt(cstate, BPF_MISC|BPF_TAX));
	} else {
		/*
		 * The offset of the link-layer payload is a constant,
		 * so no code was generated to load the (non-existent)
		 * variable part of that offset.
		 *
		 * This means we can use the 4*([k]&0xf) addressing
		 * mode.  Load the length of the IPv4 header, which
		 * is at an offset of cstate->off_nl from the beginning of
		 * the link-layer payload, and thus at an offset of
		 * cstate->off_linkpl.constant_part + cstate->off_nl from the beginning
		 * of the raw packet data, using that addressing mode.
		 */
		s = new_stmt(cstate, BPF_LDX|BPF_MSH|BPF_B);
		s->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
	}
	return s;
}